

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage> * __thiscall
kj::Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage>::operator=
          (Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage> *this,
          ControlMessage *other)

{
  PromiseFulfiller<void> *pPVar1;
  
  if ((this->ptr).isSet == true) {
    (this->ptr).isSet = false;
    anon_unknown_36::WebSocketImpl::ControlMessage::~ControlMessage(&(this->ptr).field_1.value);
  }
  (this->ptr).field_1.value.opcode = other->opcode;
  (this->ptr).field_1.value.payload.ptr = (other->payload).ptr;
  (this->ptr).field_1.value.payload.size_ = (other->payload).size_;
  (this->ptr).field_1.value.payload.disposer = (other->payload).disposer;
  (other->payload).ptr = (uchar *)0x0;
  (other->payload).size_ = 0;
  pPVar1 = (other->fulfiller).ptr.ptr;
  (this->ptr).field_1.value.fulfiller.ptr.disposer = (other->fulfiller).ptr.disposer;
  (this->ptr).field_1.value.fulfiller.ptr.ptr = pPVar1;
  (other->fulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  (this->ptr).isSet = true;
  return this;
}

Assistant:

inline Maybe& operator=(T&& other) { ptr = kj::mv(other); return *this; }